

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O0

string * base64Encode_abi_cxx11_
                   (string *__return_storage_ptr__,vector<char,_std::allocator<char>_> *data)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  char *pcVar5;
  byte *pbVar6;
  reference pvVar7;
  uint32_t bits_2;
  uint32_t bits_1;
  uint32_t bits;
  char *alphabet;
  size_t i;
  vector<char,_std::allocator<char>_> *data_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (alphabet = (char *)0x0; pcVar5 = (char *)std::vector<char,_std::allocator<char>_>::size(data)
      , alphabet + 3 <= pcVar5; alphabet = alphabet + 3) {
    pbVar6 = (byte *)std::vector<char,_std::allocator<char>_>::operator[](data,(size_type)alphabet);
    bVar1 = *pbVar6;
    pbVar6 = (byte *)std::vector<char,_std::allocator<char>_>::operator[]
                               (data,(size_type)(alphabet + 1));
    uVar4 = (uint)bVar1 << 0x10 | (uint)*pbVar6 << 8;
    pbVar6 = (byte *)std::vector<char,_std::allocator<char>_>::operator[]
                               (data,(size_type)(alphabet + 2));
    bVar2 = *pbVar6;
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [((uint)bVar1 << 0x10) >> 0x12]);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(uVar4 & 0x3f000) >> 0xc]);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(uVar4 | bVar2) >> 6 & 0x3f]);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar2 & 0x3f]);
  }
  pcVar5 = (char *)std::vector<char,_std::allocator<char>_>::size(data);
  if (alphabet + 2 == pcVar5) {
    pbVar6 = (byte *)std::vector<char,_std::allocator<char>_>::operator[](data,(size_type)alphabet);
    bVar1 = *pbVar6;
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](data,(size_type)(alphabet + 1));
    uVar3 = CONCAT11(bVar1,*pvVar7);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2]);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar3 >> 4 & 0x3f]
              );
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(ulong)(uVar3 & 0xf) * 4]);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'=');
  }
  else {
    pcVar5 = (char *)std::vector<char,_std::allocator<char>_>::size(data);
    if (alphabet + 1 == pcVar5) {
      pbVar6 = (byte *)std::vector<char,_std::allocator<char>_>::operator[]
                                 (data,(size_type)alphabet);
      bVar1 = *pbVar6;
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2]);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(bVar1 & 3) << 4]);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'=');
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'=');
    }
    else {
      pcVar5 = (char *)std::vector<char,_std::allocator<char>_>::size(data);
      if (alphabet != pcVar5) {
        __assert_fail("i == data.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/base64.h"
                      ,0x39,"std::string base64Encode(std::vector<char> &)");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string base64Encode(std::vector<char>& data) {
  std::string ret;
  size_t i = 0;

  const char* alphabet = "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         "abcdefghijklmnopqrstuvwxyz"
                         "0123456789+/";

  while (i + 3 <= data.size()) {
    uint32_t bits = (((uint32_t)(uint8_t)data[i + 0]) << 16) |
                    (((uint32_t)(uint8_t)data[i + 1]) << 8) |
                    (((uint32_t)(uint8_t)data[i + 2]) << 0);
    ret += alphabet[(bits >> 18) & 0x3f];
    ret += alphabet[(bits >> 12) & 0x3f];
    ret += alphabet[(bits >> 6) & 0x3f];
    ret += alphabet[(bits >> 0) & 0x3f];
    i += 3;
  }

  if (i + 2 == data.size()) {
    uint32_t bits = (((uint32_t)(uint8_t)data[i + 0]) << 8) |
                    (((uint32_t)(uint8_t)data[i + 1]) << 0);
    ret += alphabet[(bits >> 10) & 0x3f];
    ret += alphabet[(bits >> 4) & 0x3f];
    ret += alphabet[(bits << 2) & 0x3f];
    ret += '=';
  } else if (i + 1 == data.size()) {
    uint32_t bits = (uint32_t)(uint8_t)data[i + 0];
    ret += alphabet[(bits >> 2) & 0x3f];
    ret += alphabet[(bits << 4) & 0x3f];
    ret += '=';
    ret += '=';
  } else {
    assert(i == data.size());
  }

  return ret;
}